

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsmanal.cpp
# Opt level: O1

void __thiscall
TPZSubMeshAnalysis::TPZSubMeshAnalysis(TPZSubMeshAnalysis *this,TPZSubCompMesh *mesh)

{
  TPZReference *pTVar1;
  ulong uVar2;
  double *pdVar3;
  
  TPZLinearAnalysis::TPZLinearAnalysis
            (&this->super_TPZLinearAnalysis,&PTR_PTR_019927f8,&mesh->super_TPZCompMesh,true,
             (ostream *)&std::cout);
  (this->super_TPZLinearAnalysis).super_TPZAnalysis.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZSubMeshAnalysis_019926e8;
  (this->fReferenceSolution).super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0;
  (this->fReferenceSolution).super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0;
  (this->fReferenceSolution).super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  (this->fReferenceSolution).super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  (this->fReferenceSolution).super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_0183c898;
  (this->fReferenceSolution).fElem = (double *)0x0;
  (this->fReferenceSolution).fGiven = (double *)0x0;
  (this->fReferenceSolution).fSize = 0;
  TPZVec<int>::TPZVec(&(this->fReferenceSolution).fPivot.super_TPZVec<int>,0);
  (this->fReferenceSolution).fPivot.super_TPZVec<int>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_0183cde8;
  (this->fReferenceSolution).fPivot.super_TPZVec<int>.fStore =
       (this->fReferenceSolution).fPivot.fExtAlloc;
  (this->fReferenceSolution).fPivot.super_TPZVec<int>.fNElements = 0;
  (this->fReferenceSolution).fPivot.super_TPZVec<int>.fNAlloc = 0;
  (this->fReferenceSolution).fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  (this->fReferenceSolution).fWork.fStore = (double *)0x0;
  (this->fReferenceSolution).fWork.fNElements = 0;
  (this->fReferenceSolution).fWork.fNAlloc = 0;
  pTVar1 = (TPZReference *)operator_new(0x10);
  pTVar1->fPointer = (TPZMatrix<double> *)0x0;
  (pTVar1->fCounter).super___atomic_base<int>._M_i = 0;
  LOCK();
  (pTVar1->fCounter).super___atomic_base<int>._M_i = 1;
  UNLOCK();
  (this->fReducableStiff).fRef = pTVar1;
  this->fMesh = mesh;
  if (mesh != (TPZSubCompMesh *)0x0) {
    uVar2 = TPZCompMesh::NEquations((this->super_TPZLinearAnalysis).super_TPZAnalysis.fCompMesh);
    if (uVar2 != (this->fReferenceSolution).super_TPZMatrix<double>.super_TPZBaseMatrix.fCol *
                 (this->fReferenceSolution).super_TPZMatrix<double>.super_TPZBaseMatrix.fRow) {
      pdVar3 = (this->fReferenceSolution).fElem;
      if ((pdVar3 != (double *)0x0) && (pdVar3 != (this->fReferenceSolution).fGiven)) {
        operator_delete__(pdVar3);
      }
      pdVar3 = (this->fReferenceSolution).fGiven;
      if ((pdVar3 == (double *)0x0) || ((this->fReferenceSolution).fSize < (long)uVar2)) {
        if (uVar2 == 0) {
          pdVar3 = (double *)0x0;
        }
        else {
          pdVar3 = (double *)operator_new__(-(ulong)(uVar2 >> 0x3d != 0) | uVar2 * 8);
        }
      }
      (this->fReferenceSolution).fElem = pdVar3;
      if (pdVar3 == (double *)0x0 && uVar2 != 0) {
        TPZFMatrix<double>::Error("Resize <memory allocation error>.",(char *)0x0);
      }
    }
    (this->fReferenceSolution).super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = uVar2;
    (this->fReferenceSolution).super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
    (*(this->fReferenceSolution).super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable.
      _vptr_TPZSavable[0xf])(&this->fReferenceSolution);
  }
  return;
}

Assistant:

TPZSubMeshAnalysis::TPZSubMeshAnalysis(TPZSubCompMesh *mesh) : TPZRegisterClassId(&TPZSubMeshAnalysis::ClassId),
TPZLinearAnalysis(mesh,true), fReducableStiff(0){
	fMesh = mesh;
    if (fMesh)
    {
        fReferenceSolution.Redim(fCompMesh->NEquations(),1);
    }
}